

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O3

void __thiscall soplex::DIdxSet::DIdxSet(DIdxSet *this,DIdxSet *old)

{
  int iVar1;
  int n;
  
  (this->super_IdxSet).num = 0;
  (this->super_IdxSet).len = 0;
  (this->super_IdxSet).idx = (int *)0x0;
  (this->super_IdxSet).freeArray = false;
  (this->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR__DIdxSet_006a8bc8;
  iVar1 = (old->super_IdxSet).num;
  n = 1;
  if (1 < iVar1) {
    n = iVar1;
  }
  (this->super_IdxSet).len = n;
  spx_alloc<int*>(&(this->super_IdxSet).idx,n);
  IdxSet::operator=(&this->super_IdxSet,&old->super_IdxSet);
  return;
}

Assistant:

DIdxSet::DIdxSet(const DIdxSet& old)
   : IdxSet()
{
   len = old.size();
   len = (len < 1) ? 1 : len;
   spx_alloc(idx, len);

   IdxSet::operator= (old);
}